

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

bool __thiscall Grid::slime(Grid *this,point p)

{
  cg_box *this_00;
  cg_other *pcVar1;
  cgo_char *d;
  int *piVar2;
  pointer pcVar3;
  bool bVar4;
  
  if ((((p.x < 0) || ((long)p < 0)) || (this_00 = (this->box).ptr, this_00->w <= p.x)) ||
     (this_00->h <= p.y)) {
    pcVar1 = (this->other).ptr;
    for (pcVar3 = (pcVar1->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar3 != (pcVar1->data).
                  super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pcVar3 = pcVar3 + 1) {
      if (pcVar3->p == p) {
        piVar2 = &pcVar3->ch;
        goto LAB_0010bc53;
      }
    }
    bVar4 = false;
  }
  else {
    piVar2 = cg_box::at(this_00,p);
LAB_0010bc53:
    bVar4 = (*piVar2 & this->SLIMEBIT) != 0;
  }
  return bVar4;
}

Assistant:

bool Grid::slime(point p) {
    if (box->contains(p)) return !!(box->at(p) & SLIMEBIT);
    for (auto &d: other->data) {
        if (d.p == p) return !!(d.ch & SLIMEBIT);
    }
    return false;
}